

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompactCounters.h
# Opt level: O0

uint32 __thiscall
Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Set
          (CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this,
          CounterFields typeEnum,uint32 val,FunctionBody *host)

{
  code *pcVar1;
  bool bVar2;
  Fields *pFVar3;
  Fields **ppFVar4;
  undefined4 *puVar5;
  uint8 type;
  FunctionBody *host_local;
  uint32 val_local;
  CounterFields typeEnum_local;
  CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields> *this_local;
  
  if (this->fieldSize == '\x01') {
    if (val < 0x100) {
      pFVar3 = Memory::
               WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
               ::operator->(&this->fields);
      pFVar3[typeEnum] = SUB41(val,0);
      this_local._4_4_ = val & 0xff;
    }
    else {
      if (val < 0x10000) {
        AllocCounters<unsigned_short>(this,host);
      }
      else {
        AllocCounters<unsigned_int>(this,host);
      }
      this_local._4_4_ = Set(&host->counters,typeEnum,val,host);
    }
  }
  else if (this->fieldSize == '\x02') {
    if (val < 0x10000) {
      pFVar3 = Memory::
               WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
               ::operator->(&this->fields);
      *(short *)(pFVar3 + (ulong)typeEnum * 2) = (short)val;
      this_local._4_4_ = val & 0xffff;
    }
    else {
      AllocCounters<unsigned_int>(this,host);
      this_local._4_4_ = Set(&host->counters,typeEnum,val,host);
    }
  }
  else {
    this_local._4_4_ = val;
    if (this->fieldSize == '\x04') {
      pFVar3 = Memory::
               WriteBarrierPtr<Js::CompactCounters<Js::FunctionBody,_Js::FunctionBody::CounterFields>::Fields>
               ::operator->(&this->fields);
      *(uint32 *)(pFVar3 + (ulong)typeEnum * 4) = val;
    }
    else if (((this->fieldSize != '\0') ||
             (ppFVar4 = Memory::WriteBarrierPtr::operator_cast_to_Fields__
                                  ((WriteBarrierPtr *)&this->fields), *ppFVar4 != (Fields *)0x0)) ||
            (val != 0)) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/CompactCounters.h"
                                  ,0x6e,"(fieldSize == 0 && this->fields == nullptr && val == 0)",
                                  "fieldSize == 0 && this->fields == nullptr && val == 0");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar5 = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32 Set(CountT typeEnum, uint32 val, T* host)
        {
            uint8 type = static_cast<uint8>(typeEnum);
            if (fieldSize == 1)
            {
                if (val <= UINT8_MAX)
                {
                    return this->fields->u8Fields[type] = static_cast<uint8>(val);
                }
                else
                {
                    (val <= UINT16_MAX) ? AllocCounters<uint16>(host) : AllocCounters<uint32>(host);
                    return host->counters.Set(typeEnum, val, host);
                }
            }

            if (fieldSize == 2)
            {
                if (val <= UINT16_MAX)
                {
                    return this->fields->u16Fields[type] = static_cast<uint16>(val);
                }
                else
                {
                    AllocCounters<uint32>(host);
                    return host->counters.Set(typeEnum, val, host);
                }
            }

            if (fieldSize == 4)
            {
                return this->fields->u32Fields[type] = val;
            }

            Assert(fieldSize == 0 && this->fields == nullptr && val == 0); // OOM when allocating the counters structure
            return val;
        }